

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::Bound_Function::build_param_type_info
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,Const_Proxy_Function *t_f,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_args)

{
  pointer *ppTVar1;
  int iVar2;
  element_type *peVar3;
  iterator __position;
  type_info *ptVar4;
  undefined4 uVar5;
  bool bVar6;
  Type_Info *__args;
  long lVar7;
  long lVar8;
  ulong uVar9;
  initializer_list<chaiscript::Type_Info> __l;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> types;
  allocator_type local_61;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_60;
  Type_Info local_48;
  
  peVar3 = (t_f->
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  iVar2 = peVar3->m_arity;
  if (-1 < iVar2) {
    if (iVar2 != (int)((ulong)((long)(t_args->
                                     super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(t_args->
                                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      __assert_fail("t_f->get_arity() < 0 || t_f->get_arity() == static_cast<int>(t_args.size())",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/proxy_functions.hpp"
                    ,0x1e3,
                    "static std::vector<Type_Info> chaiscript::dispatch::Bound_Function::build_param_type_info(const Const_Proxy_Function &, const std::vector<Boxed_Value> &)"
                   );
    }
    if (-1 < iVar2) {
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
                (&local_60,&peVar3->m_types);
      if (((long)local_60.
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_60.
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
          (((long)(t_args->
                  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(t_args->
                  super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4) + 1) != 0) {
        __assert_fail("types.size() == t_args.size() + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/proxy_functions.hpp"
                      ,0x1ea,
                      "static std::vector<Type_Info> chaiscript::dispatch::Bound_Function::build_param_type_info(const Const_Proxy_Function &, const std::vector<Boxed_Value> &)"
                     );
      }
      local_48.m_flags =
           (local_60.
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
            _M_impl.super__Vector_impl_data._M_start)->m_flags;
      local_48.m_type_info =
           (local_60.
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
            _M_impl.super__Vector_impl_data._M_start)->m_type_info;
      local_48.m_bare_type_info =
           (local_60.
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
            _M_impl.super__Vector_impl_data._M_start)->m_bare_type_info;
      __l._M_len = 1;
      __l._M_array = &local_48;
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
                (__return_storage_ptr__,__l,&local_61);
      if ((long)local_60.
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_60.
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                _M_impl.super__Vector_impl_data._M_start != 0x18) {
        lVar8 = 0x18;
        lVar7 = 0;
        uVar9 = 0;
        do {
          local_48.m_type_info = (type_info *)&Placeholder_Object::typeinfo;
          local_48.m_bare_type_info = (type_info *)&Placeholder_Object::typeinfo;
          local_48.m_flags = 0;
          bVar6 = Type_Info::operator==
                            (*(Type_Info **)
                              ((long)&(((t_args->
                                        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->m_data).
                                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar7),&local_48);
          if (bVar6) {
            __args = (Type_Info *)
                     ((long)&(local_60.
                              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_type_info + lVar8);
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>::
              _M_realloc_insert<chaiscript::Type_Info_const&>
                        ((vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>> *)
                         __return_storage_ptr__,__position,__args);
            }
            else {
              uVar5 = *(undefined4 *)&__args->field_0x14;
              (__position._M_current)->m_flags = __args->m_flags;
              *(undefined4 *)&(__position._M_current)->field_0x14 = uVar5;
              ptVar4 = __args->m_bare_type_info;
              (__position._M_current)->m_type_info = __args->m_type_info;
              (__position._M_current)->m_bare_type_info = ptVar4;
              ppTVar1 = &(__return_storage_ptr__->
                         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 1;
            }
          }
          uVar9 = uVar9 + 1;
          lVar7 = lVar7 + 0x10;
          lVar8 = lVar8 + 0x18;
        } while (uVar9 < ((long)local_60.
                                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_60.
                                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555 - 1U);
      }
      if (local_60.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_60.
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_param_type_info(const Const_Proxy_Function &t_f, const std::vector<Boxed_Value> &t_args) {
        assert(t_f->get_arity() < 0 || t_f->get_arity() == static_cast<int>(t_args.size()));

        if (t_f->get_arity() < 0) {
          return std::vector<Type_Info>();
        }

        const auto types = t_f->get_param_types();
        assert(types.size() == t_args.size() + 1);

        // this analysis warning is invalid in MSVC12 and doesn't exist in MSVC14
        std::vector<Type_Info> retval{types[0]};

        for (size_t i = 0; i < types.size() - 1; ++i) {
          if (t_args[i].get_type_info() == chaiscript::detail::Get_Type_Info<Placeholder_Object>::get()) {
            retval.push_back(types[i + 1]);
          }
        }

        return retval;
      }